

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::~Context(Context *this)

{
  ostream *poVar1;
  ContextState *in_RDI;
  
  if (detail::g_cs == (in_RDI->super_ContextOptions).cout) {
    detail::g_cs = (ostream *)0x0;
  }
  poVar1 = (in_RDI->super_ContextOptions).cout;
  if (poVar1 != (ostream *)0x0) {
    detail::ContextState::~ContextState(in_RDI);
    operator_delete(poVar1,0x1160);
  }
  return;
}

Assistant:

Context::~Context() {
    if(g_cs == p)
        g_cs = nullptr;
    delete p;
}